

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactionProduct.test.cpp
# Opt level: O1

string * chunkWithLAW7_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)in_RDI,
             " 1.001000+3 9.986234-1          0          7          1          49228 6  5     \n          4          2                                            9228 6  5     \n 1.000000-5 0.000000+0 1.100000+7 8.45368-11 1.147000+7 6.622950-89228 6  5     \n 2.000000+7 2.149790-1                                            9228 6  5     \n 0.000000+0 0.000000+0          0          0          1          29228 6  5     \n          2          1                                            9228 6  5     \n 0.000000+0 1.000000-5          0          0          1          29228 6  5     \n          2          4                                            9228 6  5     \n 0.000000+0 1.000000+0          0          0          1          49228 6  5     \n          4          2                                            9228 6  5     \n 1.000000-5 0.000000+0 1.100000+7 2.000000+0 1.147000+7 4.000000+09228 6  5     \n 3.000000+7 6.000000+0                                            9228 6  5     \n 0.000000+0-1.000000+0          0          0          1          39228 6  5     \n          3          2                                            9228 6  5     \n 1.000000-5 6.000000+0 1.000000+6 4.000000+0 3.000000+7 2.000000+09228 6  5     \n 0.000000+0 2.000000+7          0          0          1          29228 6  5     \n          2          4                                            9228 6  5     \n 0.000000+0 9.000000-1          0          0          1          49228 6  5     \n          4          2                                            9228 6  5     \n 1.000000-5 1.000000+0 1.100000+7 3.000000+0 1.147000+7 5.000000+09228 6  5     \n 3.000000+7 7.000000+0                                            9228 6  5     \n 0.000000+0-9.000000-1          0          0          1          39228 6  5     \n          3          2                                            9228 6  5     \n 1.000000-5 5.000000+0 1.000000+6 3.000000+0 3.000000+7 1.000000+09228 6  5     \n"
             ,"");
  return in_RDI;
}

Assistant:

std::string chunkWithLAW7() {
  return
    " 1.001000+3 9.986234-1          0          7          1          49228 6  5     \n"
    "          4          2                                            9228 6  5     \n"
    " 1.000000-5 0.000000+0 1.100000+7 8.45368-11 1.147000+7 6.622950-89228 6  5     \n"
    " 2.000000+7 2.149790-1                                            9228 6  5     \n"
    " 0.000000+0 0.000000+0          0          0          1          29228 6  5     \n"
    "          2          1                                            9228 6  5     \n"
    " 0.000000+0 1.000000-5          0          0          1          29228 6  5     \n"
    "          2          4                                            9228 6  5     \n"
    " 0.000000+0 1.000000+0          0          0          1          49228 6  5     \n"
    "          4          2                                            9228 6  5     \n"
    " 1.000000-5 0.000000+0 1.100000+7 2.000000+0 1.147000+7 4.000000+09228 6  5     \n"
    " 3.000000+7 6.000000+0                                            9228 6  5     \n"
    " 0.000000+0-1.000000+0          0          0          1          39228 6  5     \n"
    "          3          2                                            9228 6  5     \n"
    " 1.000000-5 6.000000+0 1.000000+6 4.000000+0 3.000000+7 2.000000+09228 6  5     \n"
    " 0.000000+0 2.000000+7          0          0          1          29228 6  5     \n"
    "          2          4                                            9228 6  5     \n"
    " 0.000000+0 9.000000-1          0          0          1          49228 6  5     \n"
    "          4          2                                            9228 6  5     \n"
    " 1.000000-5 1.000000+0 1.100000+7 3.000000+0 1.147000+7 5.000000+09228 6  5     \n"
    " 3.000000+7 7.000000+0                                            9228 6  5     \n"
    " 0.000000+0-9.000000-1          0          0          1          39228 6  5     \n"
    "          3          2                                            9228 6  5     \n"
    " 1.000000-5 5.000000+0 1.000000+6 3.000000+0 3.000000+7 1.000000+09228 6  5     \n";
}